

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

sexp_conflict sexp_string_to_utf8_x(sexp_conflict ctx,sexp_conflict self,sexp_conflict str)

{
  int *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_conflict local_8;
  
  if ((((ulong)in_RDX & 3) == 0) && (*in_RDX == 9)) {
    local_8 = *(sexp_conflict *)(in_RDX + 2);
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,9,in_RDX);
  }
  return local_8;
}

Assistant:

sexp sexp_string_to_utf8_x (sexp ctx, sexp self, sexp str) {
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
#if SEXP_USE_PACKED_STRINGS
  return sexp_string_to_utf8(ctx, self, str);
#else
  return sexp_string_bytes(str);
#endif
}